

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_BinaryEqualTwoBytes_Test::testBody(TEST_TestFailure_BinaryEqualTwoBytes_Test *this)

{
  undefined *fileName;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_b0 [56];
  BinaryEqualFailure f;
  uchar actualData [2];
  uchar expectedData [2];
  TEST_TestFailure_BinaryEqualTwoBytes_Test *this_local;
  
  fileName = (anonymous_namespace)::failFileName;
  f.super_TestFailure.message_.bufferSize_._6_2_ = 0x100;
  f.super_TestFailure.message_.bufferSize_._4_2_ = 0x200;
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)(local_b0 + 0x20),"");
  BinaryEqualFailure::BinaryEqualFailure
            ((BinaryEqualFailure *)(local_b0 + 0x30),pUVar1,fileName,2,
             (uchar *)((long)&f.super_TestFailure.message_.bufferSize_ + 6),
             (uchar *)((long)&f.super_TestFailure.message_.bufferSize_ + 4),2,
             (SimpleString *)(local_b0 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_b0 + 0x20));
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_b0);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_b0);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "expected <00 01>\n\tbut was  <00 02>\n\tdifference starts at position 1 at: <      00 02         >\n\t                                               ^"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x155,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_b0);
  BinaryEqualFailure::~BinaryEqualFailure((BinaryEqualFailure *)(local_b0 + 0x30));
  return;
}

Assistant:

TEST(TestFailure, BinaryEqualTwoBytes)
{
    const unsigned char expectedData[] = {0x00, 0x01};
    const unsigned char actualData[] = {0x00, 0x02};
    BinaryEqualFailure f(test, failFileName, failLineNumber, expectedData, actualData, sizeof(expectedData), "");
    FAILURE_EQUAL("expected <00 01>\n"
                "\tbut was  <00 02>\n"
    			"\tdifference starts at position 1 at: <      00 02         >\n"
    			"\t                                               ^", f);
}